

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::DiskLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,DiskLight *light,
               string *warn,string *err,PrimReconstructOptions *options)

{
  uint uVar1;
  string *psVar2;
  bool bVar3;
  __type _Var4;
  ostream *poVar5;
  size_type sVar6;
  mapped_type *this;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  Property *args;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  int iVar10;
  allocator local_311;
  string *local_310;
  Property *local_308;
  string *local_300;
  undefined4 local_2f4;
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_2f0;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_2e8;
  string local_2e0;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  _Any_data local_d0;
  code *local_c0;
  _Any_data local_b0;
  code *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar3 = ReconstructXformOpsFromProperties
                    (spec,&table,properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,err);
  if (bVar3) {
    p_Var7 = (_Base_ptr)&(light->super_BoundableLight).purpose;
    local_2e8 = &(light->super_BoundableLight).visibility;
    p_Var8 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_310 = err;
    local_300 = warn;
    local_2f0 = (TypedAttributeWithFallback<tinyusdz::Purpose> *)p_Var7;
    while( true ) {
      name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e;
      bVar3 = (_Rb_tree_header *)p_Var8 == &(properties->_M_t)._M_impl.super__Rb_tree_header;
      local_2f4 = (undefined4)CONCAT71((int7)((ulong)p_Var7 >> 8),bVar3);
      if (bVar3) break;
      p_Var7 = p_Var8 + 1;
      ::std::__cxx11::string::string((string *)&local_50,(string *)p_Var7);
      ::std::__cxx11::string::string((string *)name,"inputs:radius",(allocator *)&local_2e0);
      local_308 = (Property *)(p_Var8 + 2);
      anon_unknown_0::ParseTypedAttribute<float>
                (&ret,&table,&local_50,(Property *)(p_Var8 + 2),name,&light->radius);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar10 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar3 = false;
        iVar10 = 3;
      }
      else {
        bVar3 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xcd9);
          ::std::operator<<(poVar5," ");
          ::std::__cxx11::string::string
                    ((string *)&local_90,"Parsing attribute `{}` failed. Error: {}",&local_311);
          fmt::format<char[14],std::__cxx11::string>
                    (&local_2e0,(fmt *)&local_90,(string *)"inputs:radius",(char (*) [14])&ret.err,
                     name);
          poVar5 = ::std::operator<<((ostream *)&ss_e,(string *)&local_2e0);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar2 = local_310;
          if (local_310 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_2e0,&local_90,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar2);
            ::std::__cxx11::string::operator=((string *)psVar2,(string *)&local_2e0);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar3 = false;
          iVar10 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (bVar3) {
        ::std::__cxx11::string::string((string *)&local_70,(string *)p_Var7);
        ::std::__cxx11::string::string((string *)&ss_e,"extent",(allocator *)&local_2e0);
        args = local_308;
        anon_unknown_0::ParseExtentAttribute
                  (&ret,&table,&local_70,local_308,(string *)&ss_e,
                   &(light->super_BoundableLight).extent);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar10 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar3 = false;
          iVar10 = 3;
        }
        else {
          bVar3 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xcda);
            ::std::operator<<(poVar5," ");
            ::std::__cxx11::string::string
                      ((string *)&local_90,"Parsing attribute `extent` failed. Error: {}",&local_311
                      );
            fmt::format<std::__cxx11::string>
                      ((string *)&local_2e0,(fmt *)&local_90,(string *)&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
            poVar5 = ::std::operator<<((ostream *)&ss_e,(string *)&local_2e0);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar2 = local_310;
            if (local_310 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((string *)&local_2e0,&local_90,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar2);
              ::std::__cxx11::string::operator=((string *)psVar2,(string *)&local_2e0);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar3 = false;
            iVar10 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar3) goto LAB_001b8533;
        bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)p_Var7,"visibility");
        if (bVar3) {
          ::std::__cxx11::string::string((string *)&ss_e,"visibility",(allocator *)&ret);
          sVar6 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&table,(key_type *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          if (sVar6 == 0) {
            Property::value_type_name_abi_cxx11_((string *)&ss_e,local_308);
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var4 = ::std::operator==((string *)&ss_e,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret);
            if ((_Var4) && (uVar1 = *(uint *)((long)&p_Var8[0x17]._M_parent + 4), uVar1 < 2)) {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (uVar1 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar5 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                poVar5 = ::std::operator<<(poVar5,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar5 = ::std::operator<<(poVar5,":");
                poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
                poVar5 = ::std::operator<<(poVar5,"():");
                poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xcdc);
                ::std::operator<<(poVar5," ");
                poVar5 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                poVar5 = ::std::operator<<(poVar5,"visibility");
                poVar5 = ::std::operator<<(poVar5,"` token attribute. Set default token value.");
                ::std::operator<<(poVar5,"\n");
                psVar2 = local_300;
                if (local_300 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_2e0,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_310);
                  ::std::__cxx11::string::operator=((string *)psVar2,(string *)&ret);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                AttrMetas::operator=(&local_2e8->_metas,(AttrMetas *)(p_Var8 + 7));
                pcVar9 = "visibility";
LAB_001b8141:
                ::std::__cxx11::string::string((string *)&ss_e,pcVar9,(allocator *)&ret);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&table,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e);
                ::std::__cxx11::string::_M_dispose();
                goto LAB_001b853e;
              }
            }
            else {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            _ss_e = VisibilityEnumHandler;
            ::std::__cxx11::string::string((string *)&ret,"visibility",(allocator *)&local_2e0);
            bVar3 = options->strict_allowedToken_check;
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function((function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_b0,
                       (function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&ss_e);
            bVar3 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                              ((string *)&ret,bVar3,
                               (EnumHandlerFun<tinyusdz::Visibility> *)&local_b0,&local_308->_attrib
                               ,local_2e8,local_300,local_310);
            if (local_a0 != (code *)0x0) {
              (*local_a0)(&local_b0,&local_b0,__destroy_functor);
            }
            ::std::__cxx11::string::_M_dispose();
            iVar10 = 1;
            if (bVar3) {
              AttrMetas::operator=(&local_2e8->_metas,(AttrMetas *)(p_Var8 + 7));
              ::std::__cxx11::string::string((string *)&ret,"visibility",(allocator *)&local_2e0);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
              ::std::__cxx11::string::_M_dispose();
              iVar10 = 3;
            }
            ::std::
            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::_M_manager((_Any_data *)&ss_e,(_Any_data *)&ss_e,__destroy_functor);
            goto LAB_001b8533;
          }
        }
        else {
          bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)p_Var7,"purpose");
          if (bVar3) {
            ::std::__cxx11::string::string((string *)&ss_e,"purpose",(allocator *)&ret);
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            if (sVar6 == 0) {
              Property::value_type_name_abi_cxx11_((string *)&ss_e,local_308);
              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
              _Var4 = ::std::operator==((string *)&ss_e,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&ret);
              if ((_Var4) && (uVar1 = *(uint *)((long)&p_Var8[0x17]._M_parent + 4), uVar1 < 2)) {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                if (uVar1 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar5 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                  poVar5 = ::std::operator<<(poVar5,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                            );
                  poVar5 = ::std::operator<<(poVar5,":");
                  poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
                  poVar5 = ::std::operator<<(poVar5,"():");
                  poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xcde);
                  ::std::operator<<(poVar5," ");
                  poVar5 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                  poVar5 = ::std::operator<<(poVar5,"purpose");
                  poVar5 = ::std::operator<<(poVar5,"` token attribute. Set default token value.");
                  ::std::operator<<(poVar5,"\n");
                  psVar2 = local_300;
                  if (local_300 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&local_2e0,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_310);
                    ::std::__cxx11::string::operator=((string *)psVar2,(string *)&ret);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  AttrMetas::operator=(&local_2f0->_metas,(AttrMetas *)(p_Var8 + 7));
                  pcVar9 = "purpose";
                  goto LAB_001b8141;
                }
              }
              else {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              _ss_e = PurposeEnumHandler;
              ::std::__cxx11::string::string((string *)&ret,"purpose",(allocator *)&local_2e0);
              bVar3 = options->strict_allowedToken_check;
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function((function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&local_d0,
                         (function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&ss_e);
              bVar3 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                ((string *)&ret,bVar3,(EnumHandlerFun<tinyusdz::Purpose> *)&local_d0
                                 ,&local_308->_attrib,local_2f0,local_300,local_310);
              if (local_c0 != (code *)0x0) {
                (*local_c0)(&local_d0,&local_d0,__destroy_functor);
              }
              ::std::__cxx11::string::_M_dispose();
              iVar10 = 1;
              if (bVar3) {
                AttrMetas::operator=(&local_2f0->_metas,(AttrMetas *)(p_Var8 + 7));
                ::std::__cxx11::string::string((string *)&ret,"purpose",(allocator *)&local_2e0);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&table,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret
                          );
                ::std::__cxx11::string::_M_dispose();
                iVar10 = 3;
              }
              ::std::
              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::_M_manager((_Any_data *)&ss_e,(_Any_data *)&ss_e,__destroy_functor);
              goto LAB_001b8533;
            }
          }
          else {
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)p_Var7);
            if (sVar6 == 0) {
              this = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::operator[](&(light->super_BoundableLight).props,(key_type *)p_Var7);
              Property::operator=(this,local_308);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var7
                        );
            }
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)p_Var7);
            if (sVar6 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar5 = ::std::operator<<((ostream *)&ss_e,"[warn]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xce0);
              ::std::operator<<(poVar5," ");
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret,"Unsupported/unimplemented property: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               p_Var7);
              poVar5 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
              ::std::operator<<(poVar5,"\n");
              ::std::__cxx11::string::_M_dispose();
              psVar2 = local_300;
              if (local_300 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&local_2e0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_310);
                ::std::__cxx11::string::operator=((string *)psVar2,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            }
          }
        }
      }
      else {
LAB_001b8533:
        if ((iVar10 != 3) && (iVar10 != 0)) break;
      }
LAB_001b853e:
      p_Var7 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8);
      p_Var8 = p_Var7;
    }
  }
  else {
    local_2f4 = 0;
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return SUB41(local_2f4,0);
}

Assistant:

bool ReconstructPrim<DiskLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    DiskLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    // PARSE_PROPERTY(prop, "inputs:colorTemperature", light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:radius", DiskLight, light->radius)
    PARSE_EXTENT_ATTRIBUTE(table, prop, kExtent, DiskLight, light->extent)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, DiskLight,
                       light->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, DiskLight,
                       light->purpose, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, DiskLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}